

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O2

int __thiscall SID::clock_fast(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  short sVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar4;
  }
  uVar5 = this->sample_offset + 0x8000;
  while( true ) {
    uVar5 = uVar5 + this->cycles_per_sample;
    iVar3 = (int)uVar5 >> 0x10;
    if (*delta_t < iVar3) break;
    if (uVar2 == uVar4) goto LAB_0013650a;
    clock(this);
    *delta_t = *delta_t - iVar3;
    uVar5 = uVar5 & 0xffff;
    this->sample_offset = uVar5 - 0x8000;
    iVar3 = (this->extfilt).Vo;
    sVar1 = (short)(iVar3 / 0xb);
    if (iVar3 < -0x5800a) {
      sVar1 = -0x8000;
    }
    if (0x57fff < iVar3) {
      sVar1 = 0x7fff;
    }
    uVar4 = uVar4 + 1;
    *buf = sVar1;
    buf = buf + interleave;
  }
  clock(this);
  this->sample_offset = this->sample_offset + *delta_t * -0x10000;
  *delta_t = 0;
  uVar2 = uVar4 & 0xffffffff;
LAB_0013650a:
  return (int)uVar2;
}

Assistant:

RESID_INLINE
int SID::clock_fast(cycle_count& delta_t, short* buf, int n,
		    int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample + (1 << (FIXP_SHIFT - 1));
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    clock(delta_t_sample);
    delta_t -= delta_t_sample;
    sample_offset = (next_sample_offset & FIXP_MASK) - (1 << (FIXP_SHIFT - 1));
    buf[s++*interleave] = output();
  }

  clock(delta_t);
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}